

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O2

int WebRtcAgc_VirtualMic
              (void *agcInst,int16_t **in_near,size_t num_bands,size_t samples,int32_t micLevelIn,
              int32_t *micLevelOut)

{
  ushort uVar1;
  short *psVar2;
  uint16_t *puVar3;
  ushort uVar4;
  size_t sVar5;
  uint16_t uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  
  uVar7 = 11000;
  if (*agcInst == 8000) {
    uVar7 = 0x157c;
  }
  psVar2 = *in_near;
  uVar9 = (int)*psVar2 * (int)*psVar2;
  uVar4 = 0;
  for (uVar10 = 1; uVar10 < samples; uVar10 = uVar10 + 1) {
    uVar1 = psVar2[uVar10];
    iVar11 = (int)(short)uVar1 * (int)(short)uVar1;
    if (uVar7 <= uVar9) {
      iVar11 = 0;
    }
    uVar9 = uVar9 + iVar11;
    uVar4 = uVar4 - ((short)(uVar1 ^ psVar2[uVar10 - 1]) >> 0xf);
  }
  if (((uVar9 < 500) || ((short)uVar4 < 6)) ||
     ((0xf < uVar4 && ((uVar9 <= uVar7 || (0x13 < uVar4)))))) {
    *(undefined2 *)((long)agcInst + 0x298) = 1;
  }
  else {
    *(undefined2 *)((long)agcInst + 0x298) = 0;
  }
  iVar8 = micLevelIn << (*(byte *)((long)agcInst + 0x15c) & 0x1f);
  iVar11 = *(int *)((long)agcInst + 0x144);
  if (*(int *)((long)agcInst + 0x13c) < *(int *)((long)agcInst + 0x144)) {
    iVar11 = *(int *)((long)agcInst + 0x13c);
  }
  if (iVar8 != *(int *)((long)agcInst + 0x130)) {
    *(int *)((long)agcInst + 0x130) = iVar8;
    *(undefined4 *)((long)agcInst + 0x13c) = 0x7f;
    iVar11 = 0x7f;
  }
  puVar3 = kSuppressionTableVirtualMic + (uint)-(iVar11 + -0x7f);
  if (0x7f < iVar11) {
    puVar3 = kGainTableVirtualMic + (iVar11 - 0x80);
  }
  uVar6 = *puVar3;
  sVar5 = 0;
  do {
    if (sVar5 == samples) {
      *(int *)((long)agcInst + 0x138) = iVar11;
      *micLevelOut = iVar11 >> (*(byte *)((long)agcInst + 0x15c) & 0x1f);
      iVar11 = WebRtcAgc_AddMic(agcInst,in_near,num_bands,samples);
      return -(uint)(iVar11 != 0);
    }
    iVar8 = (int)((uint)uVar6 * (int)psVar2[sVar5]) >> 10;
    if (iVar8 < 0x8000) {
      if (iVar8 < -0x8000) {
        if (iVar11 < 0x80) {
          iVar8 = -0x8000;
          goto LAB_0012a7e7;
        }
        iVar8 = -0x8000;
        goto LAB_0012a7c4;
      }
    }
    else {
      if (iVar11 < 0x80) {
        iVar8 = 0x7fff;
LAB_0012a7e7:
        uVar7 = 0x80 - iVar11;
        puVar3 = kSuppressionTableVirtualMic;
      }
      else {
        iVar8 = 0x7fff;
LAB_0012a7c4:
        uVar7 = iVar11 - 0x80;
        puVar3 = kGainTableVirtualMic;
      }
      iVar11 = iVar11 + -1;
      uVar6 = puVar3[uVar7];
    }
    psVar2[sVar5] = (short)iVar8;
    for (uVar10 = 1; uVar10 < num_bands; uVar10 = uVar10 + 1) {
      iVar8 = (int)((int)in_near[uVar10][sVar5] * (uint)uVar6) >> 10;
      if (0x7ffe < iVar8) {
        iVar8 = 0x7fff;
      }
      if (iVar8 < -0x7fff) {
        iVar8 = -0x8000;
      }
      in_near[uVar10][sVar5] = (int16_t)iVar8;
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

int WebRtcAgc_VirtualMic(void *agcInst, int16_t *const *in_near, size_t num_bands, size_t samples, int32_t micLevelIn,
                         int32_t *micLevelOut) {
    int32_t tmpFlt, micLevelTmp, gainIdx;
    uint16_t gain;
    size_t ii, j;
    LegacyAgc *stt;

    uint32_t nrg;
    size_t sampleCntr;
    uint32_t frameNrg = 0;
    uint32_t frameNrgLimit = 5500;
    int16_t numZeroCrossing = 0;
    const int16_t kZeroCrossingLowLim = 15;
    const int16_t kZeroCrossingHighLim = 20;

    stt = (LegacyAgc *) agcInst;

    /*
     *  Before applying gain decide if this is a low-level signal.
     *  The idea is that digital AGC will not adapt to low-level
     *  signals.
     */
    if (stt->fs != 8000) {
        frameNrgLimit = frameNrgLimit << 1;
    }

    frameNrg = (uint32_t)(in_near[0][0] * in_near[0][0]);
    for (sampleCntr = 1; sampleCntr < samples; sampleCntr++) {
        // increment frame energy if it is less than the limit
        // the correct value of the energy is not important
        if (frameNrg < frameNrgLimit) {
            nrg = (uint32_t)(in_near[0][sampleCntr] * in_near[0][sampleCntr]);
            frameNrg += nrg;
        }

        // Count the zero crossings
        numZeroCrossing += ((in_near[0][sampleCntr] ^ in_near[0][sampleCntr - 1]) < 0);
    }

    if ((frameNrg < 500) || (numZeroCrossing <= 5)) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing <= kZeroCrossingLowLim) {
        stt->lowLevelSignal = 0;
    } else if (frameNrg <= frameNrgLimit) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing >= kZeroCrossingHighLim) {
        stt->lowLevelSignal = 1;
    } else {
        stt->lowLevelSignal = 0;
    }

    micLevelTmp = micLevelIn << stt->scale;
    /* Set desired level */
    gainIdx = stt->micVol;
    if (stt->micVol > stt->maxAnalog) {
        gainIdx = stt->maxAnalog;
    }
    if (micLevelTmp != stt->micRef) {
        /* Something has happened with the physical level, restart. */
        stt->micRef = micLevelTmp;
        stt->micVol = 127;
        *micLevelOut = 127;
        stt->micGainIdx = 127;
        gainIdx = 127;
    }
    /* Pre-process the signal to emulate the microphone level. */
    /* Take one step at a time in the gain table. */
    if (gainIdx > 127) {
        gain = kGainTableVirtualMic[gainIdx - 128];
    } else {
        gain = kSuppressionTableVirtualMic[127 - gainIdx];
    }
    for (ii = 0; ii < samples; ii++) {
        tmpFlt = (in_near[0][ii] * gain) >> 10;
        if (tmpFlt > 32767) {
            tmpFlt = 32767;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        if (tmpFlt < -32768) {
            tmpFlt = -32768;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        in_near[0][ii] = (int16_t) tmpFlt;
        for (j = 1; j < num_bands; ++j) {
            tmpFlt = (in_near[j][ii] * gain) >> 10;
            if (tmpFlt > 32767) {
                tmpFlt = 32767;
            }
            if (tmpFlt < -32768) {
                tmpFlt = -32768;
            }
            in_near[j][ii] = (int16_t) tmpFlt;
        }
    }
    /* Set the level we (finally) used */
    stt->micGainIdx = gainIdx;
    //    *micLevelOut = stt->micGainIdx;
    *micLevelOut = stt->micGainIdx >> stt->scale;
    /* Add to Mic as if it was the output from a true microphone */
    if (WebRtcAgc_AddMic(agcInst, in_near, num_bands, samples) != 0) {
        return -1;
    }
    return 0;
}